

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportfields.cpp
# Opt level: O0

void __thiscall ReportFields::setDefaults(ReportFields *this)

{
  double dVar1;
  int local_18;
  int local_14;
  int i_1;
  int i;
  ReportFields *this_local;
  
  for (local_14 = 0; local_14 < 7; local_14 = local_14 + 1) {
    std::__cxx11::string::operator=
              ((string *)(this->nodeFields + local_14),NodeFieldNames[local_14]);
    this->nodeFields[local_14].precision = 3;
    dVar1 = std::numeric_limits<double>::min();
    this->nodeFields[local_14].lowerLimit = dVar1;
    dVar1 = std::numeric_limits<double>::max();
    this->nodeFields[local_14].upperLimit = dVar1;
  }
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    std::__cxx11::string::operator=
              ((string *)(this->linkFields + local_18),LinkFieldNames[local_18]);
    this->linkFields[local_18].precision = 3;
    dVar1 = std::numeric_limits<double>::max();
    this->linkFields[local_18].lowerLimit = dVar1;
    dVar1 = std::numeric_limits<double>::min();
    this->linkFields[local_18].upperLimit = dVar1;
  }
  return;
}

Assistant:

void ReportFields::setDefaults()
{
    for (int i = 0; i < NUM_NODE_FIELDS; i++)
    {
        nodeFields[i].name = NodeFieldNames[i];
        nodeFields[i].precision = 3;
        nodeFields[i].lowerLimit = numeric_limits<double>::min();
        nodeFields[i].upperLimit = numeric_limits<double>::max();
    }
    for (int i = 0; i < NUM_LINK_FIELDS; i++)
    {
        linkFields[i].name = LinkFieldNames[i];
        linkFields[i].precision = 3;
        linkFields[i].lowerLimit = numeric_limits<double>::max();
        linkFields[i].upperLimit = numeric_limits<double>::min();
    }
}